

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O0

void row_stop(int t)

{
  int in_EDI;
  int i;
  long *in_stack_00000008;
  long in_stack_00000010;
  uint local_8;
  int local_4;
  
  local_4 = in_EDI;
  if (in_EDI == 6) {
    local_4 = 4;
  }
  if (local_4 == 7) {
    local_4 = 0;
  }
  for (local_8 = 0; (int)local_8 < 0x32; local_8 = local_8 + 1) {
    if ((Seed[(int)local_8].table == (long)local_4) ||
       (Seed[(int)local_8].table == (long)tdefs[local_4].child)) {
      if ((set_seeds == 0) || (Seed[(int)local_8].usage <= Seed[(int)local_8].boundary)) {
        NthElement(in_stack_00000010,in_stack_00000008);
      }
      else {
        fprintf(_stderr,"\nSEED CHANGE: seed[%d].usage = %ld\n",(ulong)local_8,
                Seed[(int)local_8].usage);
        Seed[(int)local_8].boundary = Seed[(int)local_8].usage;
      }
    }
  }
  return;
}

Assistant:

void
row_stop(int t)	\
	{ 
	int i;
	
	/* need to allow for handling the master and detail together */
	if (t == ORDER_LINE)
		t = ORDER;
	if (t == PART_PSUPP)
		t = PART;
	
	for (i=0; i <= MAX_STREAM; i++)
		{
		if ((Seed[i].table == t) || (Seed[i].table == tdefs[t].child))
			{ 
			if (set_seeds && (Seed[i].usage > Seed[i].boundary))
				{
				fprintf(stderr, "\nSEED CHANGE: seed[%d].usage = %ld\n",
					i, Seed[i].usage); 
				Seed[i].boundary = Seed[i].usage;
				} 
			else 
				{
				NthElement((Seed[i].boundary - Seed[i].usage), &Seed[i].value);
				}
			} 
		}
	return;
	}